

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk.c
# Opt level: O3

exr_result_t
exr_write_scanline_chunk_info(exr_context_t ctxt,int part_index,int y,exr_chunk_info_t *cinfo)

{
  pthread_mutex_t *__mutex;
  int iVar1;
  uint uVar2;
  int iVar3;
  exr_priv_part_t p_Var4;
  exr_result_t eVar5;
  _func_exr_result_t_exr_const_context_t_exr_result_t *UNRECOVERED_JUMPTABLE_00;
  uint64_t uVar6;
  uint height;
  int iVar7;
  char *pcVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  exr_const_priv_part_t part;
  _func_exr_result_t_exr_const_context_t_exr_result_t_char_ptr_varargs *UNRECOVERED_JUMPTABLE;
  exr_context_t nonc;
  
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  __mutex = &ctxt->mutex;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if ((part_index < 0) || (ctxt->num_parts <= part_index)) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    eVar5 = (*ctxt->print_error)
                      (ctxt,4,"Part index (%d) out of range",(ulong)(uint)part_index,
                       ctxt->print_error);
    return eVar5;
  }
  if (cinfo == (exr_chunk_info_t *)0x0) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    UNRECOVERED_JUMPTABLE_00 = ctxt->standard_error;
    eVar5 = 3;
LAB_0012b5ae:
    eVar5 = (*UNRECOVERED_JUMPTABLE_00)(ctxt,eVar5);
    return eVar5;
  }
  p_Var4 = ctxt->parts[(uint)part_index];
  if ((p_Var4->storage_mode | EXR_STORAGE_DEEP_SCANLINE) == EXR_STORAGE_DEEP_TILED) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    UNRECOVERED_JUMPTABLE_00 = ctxt->standard_error;
    eVar5 = 0x12;
    goto LAB_0012b5ae;
  }
  if (ctxt->mode != '\x03') {
    if (ctxt->mode == '\x01') {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      UNRECOVERED_JUMPTABLE_00 = ctxt->standard_error;
      eVar5 = 9;
    }
    else {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      UNRECOVERED_JUMPTABLE_00 = ctxt->standard_error;
      eVar5 = 8;
    }
    goto LAB_0012b5ae;
  }
  uVar11 = (p_Var4->data_window).min.y;
  uVar2 = (p_Var4->data_window).max.y;
  part = (exr_const_priv_part_t)(ulong)uVar2;
  uVar9 = y - uVar11;
  if ((int)uVar2 < y || y < (int)uVar11) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    UNRECOVERED_JUMPTABLE = ctxt->print_error;
    pcVar8 = "Invalid request for scanline %d outside range of data window (%d - %d)";
    uVar9 = uVar11;
LAB_0012b706:
    eVar5 = (*UNRECOVERED_JUMPTABLE)(ctxt,3,pcVar8,(ulong)(uint)y,(ulong)uVar9,part);
    return eVar5;
  }
  iVar10 = (p_Var4->data_window).min.x;
  iVar3 = (p_Var4->data_window).max.x;
  height = (uint)p_Var4->lines_per_chunk;
  if (1 < (int)height) {
    uVar9 = (int)uVar9 / (int)height;
  }
  if (((int)uVar9 < 0) || (p_Var4->chunk_count <= (int)uVar9)) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    UNRECOVERED_JUMPTABLE = ctxt->print_error;
    part = (exr_const_priv_part_t)(ulong)(uint)p_Var4->chunk_count;
    pcVar8 = "Invalid request for scanline %d in chunk %d outside chunk count %d";
    goto LAB_0012b706;
  }
  iVar7 = uVar9 * height;
  iVar1 = iVar7 + uVar11;
  cinfo->idx = 0;
  cinfo->start_x = 0;
  cinfo->start_y = 0;
  cinfo->height = 0;
  cinfo->sample_count_data_offset = 0;
  cinfo->sample_count_table_size = 0;
  cinfo->packed_size = 0;
  cinfo->unpacked_size = 0;
  cinfo->width = 0;
  cinfo->level_x = '\0';
  cinfo->level_y = '\0';
  cinfo->type = '\0';
  cinfo->compression = '\0';
  cinfo->data_offset = 0;
  cinfo->idx = uVar9;
  cinfo->type = (char)p_Var4->storage_mode;
  cinfo->compression = (char)p_Var4->comp_type;
  cinfo->start_x = iVar10;
  cinfo->start_y = iVar1;
  iVar10 = (iVar3 - iVar10) + 1;
  cinfo->width = iVar10;
  cinfo->height = height;
  if (iVar7 < 0) {
    cinfo->start_y = uVar11;
    uVar11 = iVar7 + height;
  }
  else {
    uVar11 = height;
    if ((int)(iVar1 + height) <= (int)uVar2) goto LAB_0012b723;
    uVar11 = (uVar2 - iVar1) + 1;
    part = (exr_const_priv_part_t)(ulong)uVar11;
  }
  cinfo->height = uVar11;
LAB_0012b723:
  cinfo->level_x = '\0';
  cinfo->level_y = '\0';
  cinfo->data_offset = 0;
  cinfo->packed_size = 0;
  cinfo->sample_count_data_offset = 0;
  cinfo->sample_count_table_size = 0;
  uVar6 = compute_chunk_unpack_size(y,iVar10,uVar11,height,(int)p_Var4,part);
  cinfo->unpacked_size = uVar6;
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return 0;
}

Assistant:

exr_result_t
exr_write_scanline_chunk_info (
    exr_context_t ctxt, int part_index, int y, exr_chunk_info_t* cinfo)
{
    exr_attr_box2i_t dw;
    int              lpc, miny, cidx;
    exr_chunk_info_t nil = {0};

    EXR_LOCK_AND_DEFINE_PART (part_index);

    if (!cinfo)
        return EXR_UNLOCK_AND_RETURN (
            ctxt->standard_error (ctxt, EXR_ERR_INVALID_ARGUMENT));

    if (part->storage_mode == EXR_STORAGE_TILED ||
        part->storage_mode == EXR_STORAGE_DEEP_TILED)
    {
        return EXR_UNLOCK_AND_RETURN (
            ctxt->standard_error (ctxt, EXR_ERR_SCAN_TILE_MIXEDAPI));
    }

    if (ctxt->mode != EXR_CONTEXT_WRITING_DATA)
    {
        if (ctxt->mode == EXR_CONTEXT_WRITE)
            return EXR_UNLOCK_AND_RETURN (
                ctxt->standard_error (ctxt, EXR_ERR_HEADER_NOT_WRITTEN));
        return EXR_UNLOCK_AND_RETURN (
            ctxt->standard_error (ctxt, EXR_ERR_NOT_OPEN_WRITE));
    }

    dw = part->data_window;
    if (y < dw.min.y || y > dw.max.y)
    {
        return EXR_UNLOCK_AND_RETURN (ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid request for scanline %d outside range of data window (%d - %d)",
            y,
            dw.min.y,
            dw.max.y));
    }

    lpc  = part->lines_per_chunk;
    cidx = (y - dw.min.y);
    if (lpc > 1) cidx /= lpc;

    //if (part->lineorder == EXR_LINEORDER_DECREASING_Y)
    //    cidx = part->chunk_count - (cidx + 1);
    miny = cidx * lpc + dw.min.y;

    if (cidx < 0 || cidx >= part->chunk_count)
    {
        return EXR_UNLOCK_AND_RETURN (ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid request for scanline %d in chunk %d outside chunk count %d",
            y,
            cidx,
            part->chunk_count));
    }

    *cinfo             = nil;
    cinfo->idx         = cidx;
    cinfo->type        = (uint8_t) part->storage_mode;
    cinfo->compression = (uint8_t) part->comp_type;
    cinfo->start_x     = dw.min.x;
    cinfo->start_y     = miny;
    cinfo->width       = dw.max.x - dw.min.x + 1;
    cinfo->height      = lpc;
    if (miny < dw.min.y)
    {
        cinfo->start_y = dw.min.y;
        cinfo->height -= (dw.min.y - miny);
    }
    else if ((miny + lpc) > dw.max.y) { cinfo->height = (dw.max.y - miny + 1); }
    cinfo->level_x = 0;
    cinfo->level_y = 0;

    cinfo->sample_count_data_offset = 0;
    cinfo->sample_count_table_size  = 0;
    cinfo->data_offset              = 0;
    cinfo->packed_size              = 0;
    cinfo->unpacked_size =
        compute_chunk_unpack_size (dw.min.x, y, cinfo->width, cinfo->height, lpc, part);

    return EXR_UNLOCK_AND_RETURN (EXR_ERR_SUCCESS);
}